

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void init_compiler(Compiler *compiler,char *source)

{
  undefined1 local_c0 [8];
  VarHashTable ht;
  char *local_a8;
  size_t local_a0;
  undefined8 local_98;
  Token local_90;
  undefined8 local_70;
  Token err;
  Scanner scanner;
  char *source_local;
  Compiler *compiler_local;
  
  init_scanner((Scanner *)&err.line,source);
  memcpy(&compiler->scanner,&err.line,0x38);
  local_70 = 0x2c;
  err.type = TOKEN_OPEN_PAREN;
  err._4_4_ = 0;
  err.start = (char *)0x0;
  err.length = 1;
  *(undefined8 *)&compiler->previous = 0x2c;
  (compiler->previous).start = (char *)0x0;
  (compiler->previous).length = 0;
  *(undefined8 *)&(compiler->previous).line = 1;
  scan_token(&local_90,&compiler->scanner);
  (compiler->token).type = local_90.type;
  *(undefined4 *)&(compiler->token).field_0x4 = local_90._4_4_;
  (compiler->token).start = local_90.start;
  (compiler->token).length = local_90.length;
  (compiler->token).line = local_90.line;
  *(undefined4 *)&(compiler->token).field_0x1c = local_90._28_4_;
  scan_token((Token *)&ht.buckets,&compiler->scanner);
  *(VarHTItem ***)&compiler->next = ht.buckets;
  (compiler->next).start = local_a8;
  (compiler->next).length = local_a0;
  *(undefined8 *)&(compiler->next).line = local_98;
  var_ht_init((VarHashTable *)local_c0,0x10);
  compiler->scope[0].cap = local_c0._0_4_;
  compiler->scope[0].size = local_c0._4_4_;
  compiler->scope[0].buckets = (VarHTItem **)ht._0_8_;
  compiler->scope_depth = 0;
  compiler->vars_in_scope = 0;
  compiler->print_expr = false;
  return;
}

Assistant:

static void init_compiler(Compiler *compiler, const char *source) {
    Scanner scanner;
    init_scanner(&scanner, source);

    compiler->scanner = scanner;
    Token err = {TOKEN_ERROR, NULL, 0, 1};
    compiler->previous = err;
    compiler->token = scan_token(&compiler->scanner);
    compiler->next = scan_token(&compiler->scanner);

    VarHashTable ht;
    var_ht_init(&ht, 16);
    compiler->scope[0] = ht;

    compiler->scope_depth = 0;
    compiler->vars_in_scope = 0;
    compiler->print_expr = false;
}